

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergePartialFromCodedStream
          (CodeGeneratorRequest *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  string *psVar5;
  char *pcVar6;
  FileDescriptorProto *value;
  UnknownFieldSet *unknown_fields;
  uint32 tag;
  CodedInputStream *input_local;
  CodeGeneratorRequest *this_local;
  uint32 local_50;
  
  do {
    while( true ) {
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
        input->last_tag_ = (uint)*input->buffer_;
        io::CodedInputStream::Advance(input,1);
        local_50 = input->last_tag_;
      }
      else {
        uVar2 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar2;
        local_50 = input->last_tag_;
      }
      if (local_50 == 0) {
        return true;
      }
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_50);
      if (iVar3 == 1) break;
      if (iVar3 == 2) {
        WVar4 = internal::WireFormatLite::GetTagWireType(local_50);
        if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_00245703;
      }
      else if ((iVar3 == 0xf) &&
              (WVar4 = internal::WireFormatLite::GetTagWireType(local_50),
              WVar4 == WIRETYPE_LENGTH_DELIMITED)) goto LAB_0024587b;
LAB_002459c2:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_50);
      if (WVar4 == WIRETYPE_END_GROUP) {
        return true;
      }
      unknown_fields = mutable_unknown_fields(this);
      bVar1 = internal::WireFormat::SkipField(input,local_50,unknown_fields);
      if (!bVar1) {
        return false;
      }
    }
    WVar4 = internal::WireFormatLite::GetTagWireType(local_50);
    if (WVar4 != WIRETYPE_LENGTH_DELIMITED) goto LAB_002459c2;
    do {
      psVar5 = add_file_to_generate_abi_cxx11_(this);
      bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
      if (!bVar1) {
        return false;
      }
      iVar3 = file_to_generate_size(this);
      file_to_generate_abi_cxx11_(this,iVar3 + -1);
      pcVar6 = (char *)std::__cxx11::string::data();
      iVar3 = file_to_generate_size(this);
      file_to_generate_abi_cxx11_(this,iVar3 + -1);
      iVar3 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8String(pcVar6,iVar3,PARSE);
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\n')) {
        io::CodedInputStream::Advance(input,1);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    } while (bVar1);
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x12')) {
      io::CodedInputStream::Advance(input,1);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
LAB_00245703:
      psVar5 = mutable_parameter_abi_cxx11_(this);
      bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
      if (!bVar1) {
        return false;
      }
      parameter_abi_cxx11_(this);
      pcVar6 = (char *)std::__cxx11::string::data();
      parameter_abi_cxx11_(this);
      iVar3 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8String(pcVar6,iVar3,PARSE);
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'z')) {
        io::CodedInputStream::Advance(input,1);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
LAB_0024587b:
        do {
          value = add_proto_file(this);
          bVar1 = internal::WireFormatLite::
                  ReadMessageNoVirtual<google::protobuf::FileDescriptorProto>(input,value);
          if (!bVar1) {
            return false;
          }
          if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'z')) {
            io::CodedInputStream::Advance(input,1);
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        } while (bVar1);
        bVar1 = io::CodedInputStream::ExpectAtEnd(input);
        if (bVar1) {
          return true;
        }
      }
    }
  } while( true );
}

Assistant:

bool CodeGeneratorRequest::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated string file_to_generate = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_file_to_generate:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_file_to_generate()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->file_to_generate(this->file_to_generate_size() - 1).data(),
            this->file_to_generate(this->file_to_generate_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(10)) goto parse_file_to_generate;
        if (input->ExpectTag(18)) goto parse_parameter;
        break;
      }

      // optional string parameter = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_parameter:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_parameter()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->parameter().data(), this->parameter().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_proto_file;
        break;
      }

      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_proto_file:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_proto_file()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_proto_file;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}